

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

bool __thiscall SkipList::insertElement(SkipList *this,int value)

{
  int iVar1;
  Element *pEVar2;
  int i;
  uint uVar3;
  int new_height;
  long lVar4;
  Element *pEVar5;
  allocator_type local_49;
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> update;
  
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
            (&update,(long)this->MAX_HEIGHT + 1,&local_49);
  pEVar5 = &this->head;
  for (uVar3 = this->height; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    pEVar2 = pEVar5;
    do {
      pEVar5 = pEVar2;
      pEVar2 = (pEVar5->next).
               super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar3];
    } while (pEVar2->value < value);
    update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = pEVar5;
  }
  iVar1 = (*(pEVar5->next).
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start)->value;
  if (iVar1 != value) {
    new_height = randomHeight(this);
    lVar4 = (long)this->height;
    if (this->height < new_height) {
      for (; lVar4 < new_height; lVar4 = lVar4 + 1) {
        update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl
        .super__Vector_impl_data._M_start[lVar4 + 1] = &this->head;
      }
      this->height = new_height;
    }
    pEVar5 = (Element *)operator_new(0x20);
    Element::Element(pEVar5,value,new_height);
    for (lVar4 = 0; lVar4 <= new_height; lVar4 = lVar4 + 1) {
      (pEVar5->next).super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar4] =
           (update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar4]->next).
           super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
      (update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
       super__Vector_impl_data._M_start[lVar4]->next).
      super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = pEVar5;
    }
  }
  std::_Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::~_Vector_base
            (&update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>);
  return iVar1 != value;
}

Assistant:

bool SkipList::insertElement(int value) {
    std::vector<Element *> update((unsigned long long) (MAX_HEIGHT + 1));
    Element *p = &head;

    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
        update[i] = p;
    }
    p = p->next[0];

    if (p->value == value) {
        return false;    // key x exists already in list
    }

    int new_height = randomHeight();
    if (new_height > height) {  // link new Element to head, adjust list height
        for (int i = height + 1; i <= new_height; ++i) {
            update[i] = &head;
        }
        height = new_height;
    }

    // create new Element with height new_height and key x
    p = new Element(value, new_height);

    // insert p into level i lists immediately after Element update[i]
    for (int i = 0; i <= new_height; ++i) {
        p->next[i] = update[i]->next[i];
        update[i]->next[i] = p;
    }
    return true;
}